

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O3

bool __thiscall Sphere::intersect(Sphere *this,Ray *ray,double *t)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  SphereTestCount = SphereTestCount + 1;
  dVar2 = (this->loc).x - (ray->org).x;
  dVar3 = (this->loc).y - (ray->org).y;
  dVar4 = (this->loc).z - (ray->org).z;
  dVar5 = dVar4 * (ray->dir).z + dVar2 * (ray->dir).x + dVar3 * (ray->dir).y;
  dVar2 = dVar5 * dVar5 + (this->radius2 - (dVar4 * dVar4 + dVar2 * dVar2 + dVar3 * dVar3));
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    uVar1 = -(ulong)(dVar5 < dVar2);
    dVar3 = (double)(~uVar1 & (ulong)-dVar2 | uVar1 & (ulong)dVar2) + dVar5;
    *t = dVar3;
    if (ABS(dVar3) < geom_threshold) {
      dVar3 = dVar5 + (double)(~uVar1 & (ulong)dVar2 | (ulong)-dVar2 & uVar1);
      *t = dVar3;
    }
    if (geom_threshold < dVar3) {
      return true;
    }
  }
  SphereTestMisses = SphereTestMisses + 1;
  return false;
}

Assistant:

bool Sphere::intersect(Ray& ray, double& t)
{
   STAT( SphereTestCount++  );

   Vector l = loc - ray.org;
   double l20c = l   & l;
   double tca = l & ray.dir;
   double t2hc = radius2 - l20c + tca * tca;
   double t2;

   if(   t2hc <=  0.0   )
   {
      STAT( SphereTestMisses++ );
      return false;
   }

   t2hc = sqrt(t2hc);

   if(   tca   < t2hc)  // we are inside
   {
      t  = tca + t2hc;
      t2 = tca - t2hc;
   }
   else        // we are outside
   {
      t  = tca - t2hc;
      t2 = tca + t2hc;
   }

   if(   fabs(t)  < geom_threshold ) t = t2;

   if(   t >   geom_threshold )
      return true;
   else
   {
      STAT(SphereTestMisses++);
      return false;
   }
}